

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O0

void Am_Get_Filtered_Input(Am_Object *inter,Am_Object *ref_obj,int x,int y,int *out_x,int *out_y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  int grid_y_div_2;
  int grid_x_div_2;
  int grid_origin_y;
  int grid_origin_x;
  int grid_y;
  int grid_x;
  undefined1 local_60 [8];
  Am_Custom_Gridding_Method method;
  undefined1 local_40 [8];
  Am_Value value;
  int *out_y_local;
  int *out_x_local;
  int y_local;
  int x_local;
  Am_Object *ref_obj_local;
  Am_Object *inter_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)out_y;
  Am_Value::Am_Value((Am_Value *)local_40);
  pAVar5 = Am_Object::Get(inter,0xd2,0);
  Am_Value::operator=((Am_Value *)local_40,pAVar5);
  bVar1 = Am_Value::Valid((Am_Value *)local_40);
  if (bVar1) {
    Am_Custom_Gridding_Method::Am_Custom_Gridding_Method((Am_Custom_Gridding_Method *)local_60);
    Am_Custom_Gridding_Method::operator=((Am_Custom_Gridding_Method *)local_60,(Am_Value *)local_40)
    ;
    Am_Object::Am_Object((Am_Object *)&grid_y,inter);
    (*(code *)method.from_wrapper)(&grid_y,ref_obj,x,y,out_x,value.value.wrapper_value);
    Am_Object::~Am_Object((Am_Object *)&grid_y);
  }
  else {
    pAVar5 = Am_Object::Get(inter,0xce,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    if (iVar2 == 0) {
      *out_x = x;
      *(int *)&((value.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type = y;
    }
    else {
      pAVar5 = Am_Object::Get(inter,0xcf,0);
      grid_origin_y = Am_Value::operator_cast_to_int(pAVar5);
      if (grid_origin_y == 0) {
        grid_origin_y = iVar2;
      }
      pAVar5 = Am_Object::Get(inter,0xd0,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      pAVar5 = Am_Object::Get(inter,0xd1,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      *out_x = iVar3 + iVar2 * (((x + iVar2 / 2) - iVar3) / iVar2);
      *(int *)&((value.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type =
           iVar4 + grid_origin_y * (((y + grid_origin_y / 2) - iVar4) / grid_origin_y);
    }
  }
  Am_Value::~Am_Value((Am_Value *)local_40);
  return;
}

Assistant:

void
Am_Get_Filtered_Input(Am_Object inter, const Am_Object &ref_obj, int x, int y,
                      int &out_x, int &out_y)
{
  Am_Value value;
  value = inter.Get(Am_GRID_METHOD);
  if (value.Valid()) {
    Am_Custom_Gridding_Method method;
    method = value;
    Am_INTER_TRACE_PRINT(inter, "Custom Gridding function " << method);
    method.Call(inter, ref_obj, x, y, out_x, out_y);
    Am_INTER_TRACE_PRINT(inter, "     maps (" << x << "," << y << " to ("
                                              << out_x << "," << out_y << ")");
  } else { // if no procedure, check gridding by numbers
    int grid_x = inter.Get(Am_GRID_X);
    if (grid_x) { // then do some gridding by number
      int grid_y = inter.Get(Am_GRID_Y);
      if (!grid_y)
        grid_y = grid_x; // use same value in each
                         // direction if y not supplied
      // ok for origins to be zero
      int grid_origin_x = inter.Get(Am_GRID_ORIGIN_X);
      int grid_origin_y = inter.Get(Am_GRID_ORIGIN_Y);
      int grid_x_div_2 = grid_x / 2;
      int grid_y_div_2 = grid_y / 2;

      out_x = grid_origin_x +
              (grid_x * (((x + grid_x_div_2) - grid_origin_x) / grid_x));
      out_y = grid_origin_y +
              (grid_y * (((y + grid_y_div_2) - grid_origin_y) / grid_y));
      Am_INTER_TRACE_PRINT(inter, "Gridding maps (" << x << "," << y << " to ("
                                                    << out_x << "," << out_y
                                                    << ")");
    } else {
      out_x = x;
      out_y = y;
    }
  }
}